

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

EffectiveSign __thiscall
slang::ast::IntegerLiteral::getEffectiveSignImpl(IntegerLiteral *this,bool isForConversion)

{
  bitwidth_t bVar1;
  EffectiveSign EVar2;
  undefined7 in_register_00000031;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_18;
  bitwidth_t local_10;
  byte local_c;
  byte local_b;
  
  SVInt::SVInt((SVInt *)&local_18,&this->valueStorage);
  if ((int)CONCAT71(in_register_00000031,isForConversion) == 0) {
    EVar2 = Either;
    if (local_b != 0) goto LAB_0041d0f0;
    bVar1 = SVInt::getActiveBits((SVInt *)&local_18);
    if (bVar1 != local_10) goto LAB_0041d0f0;
  }
  EVar2 = (EffectiveSign)local_c;
LAB_0041d0f0:
  if (((0x40 < local_10) || ((local_b & 1) != 0)) && ((void *)local_18.val != (void *)0x0)) {
    operator_delete__(local_18.pVal);
  }
  return EVar2;
}

Assistant:

Expression::EffectiveSign IntegerLiteral::getEffectiveSignImpl(bool isForConversion) const {
    // We will say that this literal could have been signed if doing
    // so would not change its logical value (i.e. it either already
    // was marked signed, or it's a positive value that would remain
    // positive given a cast to a signed type).
    //
    // We will not warn if the value contains unknowns -- the rationale
    // is that signed-related warnings make no sense in those cases, though
    // we should probably warn separately about the unknowns themselves.
    auto&& val = getValue();
    if (isForConversion || (!val.hasUnknown() && val.getActiveBits() == val.getBitWidth())) {
        return val.isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
    }

    return EffectiveSign::Either;
}